

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O1

int latency_macro_test(void)

{
  LatencyCollector *pLVar1;
  _Rb_tree_node_base *p_Var2;
  __atomic_base<unsigned_long> *p_Var3;
  ulong uVar4;
  string *lat_name;
  long lVar5;
  ulong uVar6;
  initializer_list<unsigned_long> __l;
  initializer_list<std::function<void_()>_> __l_00;
  LatencyDumpDefaultImpl default_dump;
  LatencyItem chk;
  vector<unsigned_long,_std::allocator<unsigned_long>_> n_calls;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> funcs;
  LatencyCollectWrapper LCW__block_latency__;
  map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  hist;
  LatencyDump local_148;
  LatencyCollectorDumpOptions local_140;
  _Any_data local_138;
  undefined1 local_128 [16];
  code *local_118;
  double dStack_110;
  HistBin *local_108;
  __atomic_base<unsigned_long> _Stack_100;
  __atomic_base<unsigned_long> local_f8;
  __atomic_base<unsigned_long> _Stack_f0;
  code *local_e8 [3];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_b8;
  string local_a0;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  local_60;
  
  pLVar1 = (LatencyCollector *)operator_new(0x58);
  LatencyCollector::LatencyCollector(pLVar1);
  local_138._M_unused._M_member_pointer = 0x17;
  local_138._8_8_ = 0x13;
  local_128._0_8_ = 0xd;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_138;
  global_lat = pLVar1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d0,__l,(allocator_type *)&local_a0);
  local_138._8_8_ = 0;
  local_138._M_unused._M_object = test_function_1ms;
  local_128._8_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_128._0_8_ = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  dStack_110 = 0.0;
  local_118 = test_function_2ms;
  _Stack_100._M_i = (__int_type)std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_108 = (HistBin *)std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  _Stack_f0._M_i = 0;
  local_f8._M_i = (__int_type)test_function_3ms;
  local_e8[1] = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_e8[0] = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_138;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (&local_b8,__l_00,(allocator_type *)&local_a0);
  lVar5 = -0x60;
  p_Var3 = &local_f8;
  do {
    if ((code *)p_Var3[2]._M_i != (code *)0x0) {
      (*(code *)p_Var3[2]._M_i)(p_Var3,p_Var3,3);
    }
    p_Var3 = p_Var3 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      pLVar1 = global_lat;
      local_138._M_unused._M_object = local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"outer for-loop","");
      LatencyCollectWrapper::LatencyCollectWrapper
                ((LatencyCollectWrapper *)&local_a0,pLVar1,(string *)&local_138);
      if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
        operator_delete(local_138._M_unused._M_object);
      }
      if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] != 0) {
        uVar6 = 0;
        do {
          if (local_b8.
              super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar4].super__Function_base._M_manager ==
              (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (**(code **)((long)(local_b8.
                              super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar4) + 0x18))
                    ((_Any_data *)
                     (local_b8.
                      super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar4));
          uVar6 = uVar6 + 1;
        } while (uVar6 < local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar4]);
      }
      LatencyCollectWrapper::~LatencyCollectWrapper((LatencyCollectWrapper *)&local_a0);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_d0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (*(long *)((long)&((local_b8.
                             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                           _M_manager + lVar5) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)((long)&(local_b8.
                           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_invoker + lVar5))
                ((long)&((local_b8.
                          super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                        _M_functor + lVar5);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < (ulong)((long)local_d0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[2] != 0xffffffffffffffff) {
    uVar4 = 0;
    do {
      test_function_4ms();
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[2] + 1);
  }
  local_148._vptr_LatencyDump = (_func_int **)&PTR_dump_abi_cxx11__0010ecd8;
  local_140.sort_by = TOTAL_TIME;
  local_140.view_type = TREE;
  LatencyCollector::dump_abi_cxx11_((string *)&local_138,global_lat,&local_148,&local_140);
  if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
      (((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
       (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_138._M_unused._0_8_,local_138._8_8_);
  }
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  local_140.sort_by = AVG_LATENCY;
  LatencyCollector::dump_abi_cxx11_((string *)&local_138,global_lat,&local_148,&local_140);
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_138._M_unused._0_8_,local_138._8_8_);
  }
  if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
      (((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
       (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  local_140.sort_by = NUM_CALLS;
  LatencyCollector::dump_abi_cxx11_((string *)&local_138,global_lat,&local_148,&local_140);
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_138._M_unused._0_8_,local_138._8_8_);
  }
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  local_140.sort_by = TOTAL_TIME;
  local_140.view_type = FLAT;
  LatencyCollector::dump_abi_cxx11_((string *)&local_138,global_lat,&local_148,&local_140);
  if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
      (((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
       (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_138._M_unused._0_8_,local_138._8_8_);
  }
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  local_140.sort_by = AVG_LATENCY;
  LatencyCollector::dump_abi_cxx11_((string *)&local_138,global_lat,&local_148,&local_140);
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_138._M_unused._0_8_,local_138._8_8_);
  }
  if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
      (((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
       (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  local_140.sort_by = NUM_CALLS;
  LatencyCollector::dump_abi_cxx11_((string *)&local_138,global_lat,&local_148,&local_140);
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_138._M_unused._0_8_,local_138._8_8_);
  }
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"test_function_3ms","");
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"inner_function","");
  lVar5 = 0;
  do {
    lat_name = (string *)((long)local_80 + lVar5 + -0x20);
    LatencyCollector::getAggrItem((LatencyItem *)&local_138,global_lat,lat_name);
    if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
        (((*TestSuite::getCurTest()::cur_test != '\0' ||
          (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
         (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
       (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(lat_name->_M_dataplus)._M_p,
                 *(long *)((long)local_80 + lVar5 + -0x18));
    }
    if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
         ((*TestSuite::getCurTest()::cur_test != '\0' ||
          (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
        (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
       (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
    }
    if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
         ((*TestSuite::getCurTest()::cur_test != '\0' ||
          (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
        (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
       (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"total ",6);
    }
    if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
        (((*TestSuite::getCurTest()::cur_test != '\0' ||
          (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
         (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
       (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    }
    if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
         ((*TestSuite::getCurTest()::cur_test != '\0' ||
          (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
        (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
       (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," us, ",5);
    }
    if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
         ((*TestSuite::getCurTest()::cur_test != '\0' ||
          (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
        (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
       (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    }
    if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
        (((*TestSuite::getCurTest()::cur_test != '\0' ||
          (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
         (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
       (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," calls",6);
    }
    if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
         ((*TestSuite::getCurTest()::cur_test != '\0' ||
          (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
        (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
       (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
    }
    LatencyItem::dumpHistogram
              ((map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                *)&local_60,(LatencyItem *)&local_138);
    for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
           ((*TestSuite::getCurTest()::cur_test != '\0' ||
            (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
          (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
         (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"less than ",10);
      }
      if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
          (((*TestSuite::getCurTest()::cur_test != '\0' ||
            (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
           (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
         (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
        std::ostream::_M_insert<double>(*(double *)(p_Var2 + 1));
      }
      if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
           ((*TestSuite::getCurTest()::cur_test != '\0' ||
            (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
          (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
         (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      }
      if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
           ((*TestSuite::getCurTest()::cur_test != '\0' ||
            (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
          (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
         (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
      if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
          (((*TestSuite::getCurTest()::cur_test != '\0' ||
            (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
           (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
         (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
      }
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    if (local_108 != (HistBin *)0x0) {
      operator_delete__(local_108);
    }
    if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
      operator_delete(local_138._M_unused._M_object);
    }
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x40);
  lVar5 = 0;
  do {
    if (local_70 + lVar5 != *(undefined1 **)((long)local_80 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_80 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  local_a0._M_dataplus._M_p = (pointer)0x0;
  LatencyCollector::dump_abi_cxx11_
            ((string *)&local_138,global_lat,(LatencyDump *)0x0,
             (LatencyCollectorDumpOptions *)&local_a0);
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_138._M_unused._0_8_,local_138._8_8_);
  }
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  pLVar1 = global_lat;
  if (global_lat != (LatencyCollector *)0x0) {
    LatencyCollector::~LatencyCollector(global_lat);
    operator_delete(pLVar1);
  }
  global_lat = (LatencyCollector *)0x0;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_b8);
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int latency_macro_test() {
    global_lat = new LatencyCollector();

    size_t i, j;
    std::vector<size_t> n_calls = {23, 19, 13};
    std::vector<std::function<void()> >
            funcs = {test_function_1ms,
                     test_function_2ms,
                     test_function_3ms};

    for (i=0; i<n_calls.size(); ++i) {
        collectBlockLatency(global_lat, "outer for-loop");
        for (j=0; j<n_calls[i]; ++j) {
            funcs[i]();
        }
    }

    for (i=0; i<n_calls.size(); ++i) {
        funcs[i]();
    }

    for (i=0; i<n_calls[2]+1; ++i) {
        test_function_4ms();
    }

    LatencyDumpDefaultImpl default_dump;
    TestSuite::Msg msg_stream;

    LatencyCollectorDumpOptions opt;
    opt.view_type = LatencyCollectorDumpOptions::TREE;
    opt.sort_by = LatencyCollectorDumpOptions::TOTAL_TIME;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::AVG_LATENCY;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::NUM_CALLS;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.view_type = LatencyCollectorDumpOptions::FLAT;
    opt.sort_by = LatencyCollectorDumpOptions::TOTAL_TIME;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::AVG_LATENCY;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    opt.sort_by = LatencyCollectorDumpOptions::NUM_CALLS;
    msg_stream << global_lat->dump(&default_dump, opt) << std::endl;

    for ( const std::string& item_name: { std::string("test_function_3ms"),
                                          std::string("inner_function") } ) {
        LatencyItem chk = global_lat->getAggrItem(item_name);
        msg_stream << item_name << ": "
                   << "total " << chk.getTotalTime() << " us, "
                   << chk.getNumCalls() << " calls" << std::endl;
        std::map<double, uint64_t> hist = chk.dumpHistogram();
        for (auto& entry: hist) {
            msg_stream << "less than " << entry.first << ": "
                       << entry.second << std::endl;
        }
    }

    msg_stream << global_lat->dump(nullptr) << std::endl;

    delete global_lat;
    global_lat = nullptr;

    return 0;
}